

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O0

void __thiscall wasm::CodePushing::doWalkFunction(CodePushing *this,Function *func)

{
  size_t __new_size;
  Function *func_local;
  CodePushing *this_local;
  
  LocalAnalyzer::analyze(&this->analyzer,func);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->numGetsSoFar);
  __new_size = Function::getNumLocals(func);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->numGetsSoFar,__new_size);
  Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::walk
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
              ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
              super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,&func->body);
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    // pre-scan to find which vars are sfa, and also count their gets&sets
    analyzer.analyze(func);
    // prepare to walk
    numGetsSoFar.clear();
    numGetsSoFar.resize(func->getNumLocals());
    // walk and optimize
    walk(func->body);
  }